

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O0

void __thiscall Worker::heartbeat(Worker *this,error_code *param_1)

{
  atomic<unsigned_long> *paVar1;
  bool local_71;
  bind_t<void,_boost::_mfi::mf1<void,_Worker,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<Worker_*>,_boost::arg<1>_(*)()>_>
  local_60;
  int local_44;
  subsecond_duration<boost::posix_time::time_duration,_1000L> local_40;
  bool local_31;
  error_code *peStack_30;
  bool stop;
  error_code *param_1_local;
  Worker *this_local;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  local_71 = false;
  peStack_30 = param_1;
  param_1_local = (error_code *)this;
  if ((this->m_stopFlag & 1U) != 0) {
    paVar1 = &this->m_pendingJobCount;
    local_14 = 5;
    ___b = paVar1;
    local_18 = std::operator&(seq_cst,__memory_order_mask);
    if (local_14 - 1U < 2) {
      this_local = (Worker *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_14 == 5) {
      this_local = (Worker *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      this_local = (Worker *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
    }
    local_71 = this_local == (Worker *)0x0;
  }
  local_31 = local_71;
  if (local_71 == false) {
    local_44 = 1;
    boost::date_time::subsecond_duration<boost::posix_time::time_duration,_1000L>::
    subsecond_duration<int>(&local_40,&local_44,(type *)0x0);
    boost::asio::
    basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_from_now(&this->m_wrkTimer,&local_40.super_time_duration);
    boost::bind<void,Worker,boost::system::error_code_const&,Worker*,boost::arg<1>(*)()>
              (&local_60,(boost *)heartbeat,0,this,boost::asio::placeholders::error);
    boost::asio::
    basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::
    async_wait<boost::_bi::bind_t<void,_boost::_mfi::mf1<void,_Worker,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<Worker_*>,_boost::arg<1>_(*)()>_>_>
              (&this->m_wrkTimer,&local_60);
  }
  return;
}

Assistant:

void heartbeat(const boost::system::error_code& /*e*/)
	{
        bool stop = m_stopFlag && m_pendingJobCount.load() == 0;
        if(!stop) {
		    m_wrkTimer.expires_from_now(boost::posix_time::milliseconds(1));
		    m_wrkTimer.async_wait(boost::bind(&Worker::heartbeat, this, boost::asio::placeholders::error));
        }
        else
        {
#if DEBUG
            std::stringstream ss;
            ss << "Worker " << m_name << " completed " << std::this_thread::get_id() << ": " << m_jobCount << " : processed : " << m_processedJobs << std::endl;
            std::cout << ss.str();
            std::cout.flush();
#endif
        }
	}